

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_shell_sort(int64_t *dst,size_t size)

{
  long lVar1;
  bool bVar2;
  size_t j;
  int64_t temp;
  size_t i;
  size_t inc;
  int inci;
  size_t size_local;
  int64_t *dst_local;
  
  inci = 0x2f;
  inc = 0x5062658055d8af4e;
  if (1 < size) {
    while (size >> 1 < inc) {
      inci = inci + -1;
      inc = shell_gaps[inci];
    }
    while( true ) {
      for (i = inc; i < size; i = i + 1) {
        lVar1 = dst[i];
        j = i;
        while( true ) {
          bVar2 = false;
          if (inc <= j) {
            bVar2 = 0 < dst[j - inc] - lVar1;
          }
          if (!bVar2) break;
          dst[j] = dst[j - inc];
          j = j - inc;
        }
        dst[j] = lVar1;
      }
      if (inc == 1) break;
      inci = inci + -1;
      inc = shell_gaps[inci];
    }
  }
  return;
}

Assistant:

void SHELL_SORT(SORT_TYPE *dst, const size_t size) {
  /* don't bother sorting an array of size 0 or 1 */
  /* TODO: binary search to find first gap? */
  int inci = 47;
  size_t inc = shell_gaps[inci];
  size_t i;

  if (size <= 1) {
    return;
  }

  while (inc > (size >> 1)) {
    inc = shell_gaps[--inci];
  }

  while (1) {
    for (i = inc; i < size; i++) {
      SORT_TYPE temp = dst[i];
      size_t j = i;

      while ((j >= inc) && (SORT_CMP(dst[j - inc], temp) > 0)) {
        dst[j] = dst[j - inc];
        j -= inc;
      }

      dst[j] = temp;
    }

    if (inc == 1) {
      break;
    }

    inc = shell_gaps[--inci];
  }
}